

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O0

coop_ref_t __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::ensure_root_coop_exists
          (deregistration_processor_t *this)

{
  bool bVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  coop_ref_t cVar3;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  _Self local_28;
  _Self local_20;
  iterator it;
  deregistration_processor_t *this_local;
  
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
               *)(*in_RSI + 0x38),(key_type *)in_RSI[1]);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
              *)(*in_RSI + 0x38));
  bVar1 = std::operator==(&local_28,&local_20);
  if (bVar1) {
    std::operator+((char *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "coop with name \'");
    std::operator+(local_48,(char *)local_68);
    exception_t::raise(0x51ca43);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string(local_68);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>
           ::operator->(&local_20);
  std::shared_ptr<so_5::coop_t>::shared_ptr((shared_ptr<so_5::coop_t> *)this,&ppVar2->second);
  cVar3.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar3.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (coop_ref_t)cVar3.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

coop_ref_t
deregistration_processor_t::ensure_root_coop_exists() const
{
	// It is an error if the cooperation is not registered.
	auto it = m_core.m_registered_coop.find( m_root_coop_name );

	if( m_core.m_registered_coop.end() == it )
	{
		SO_5_THROW_EXCEPTION(
			rc_coop_has_not_found_among_registered_coop,
			"coop with name '" + m_root_coop_name +
			"' not found among registered cooperations" );
	}

	return it->second;
}